

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tty.c
# Opt level: O0

int run_test_tty(void)

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  int *piVar6;
  char *pcVar7;
  undefined8 uVar8;
  uv_loop_t *puVar9;
  uv_loop_t *loop;
  uv_tty_t tty_out;
  uv_tty_t tty_in;
  int ttyout_fd;
  int ttyin_fd;
  int height;
  int width;
  int r;
  
  uVar5 = uv_default_loop();
  iVar2 = open64("/dev/tty",0);
  pFVar1 = _stderr;
  if (iVar2 < 0) {
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    fprintf(pFVar1,"Cannot open /dev/tty as read-only: %s\n",pcVar7);
    fflush(_stderr);
    width = 1;
  }
  else {
    iVar3 = open64("/dev/tty",1,0);
    pFVar1 = _stderr;
    if (iVar3 < 0) {
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      fprintf(pFVar1,"Cannot open /dev/tty as write-only: %s\n",pcVar7);
      fflush(_stderr);
      width = 1;
    }
    else {
      if (iVar2 < 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
                ,0x59,"ttyin_fd >= 0");
        abort();
      }
      if (iVar3 < 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
                ,0x5a,"ttyout_fd >= 0");
        abort();
      }
      iVar4 = uv_guess_handle(0xffffffff);
      if (iVar4 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
                ,0x5c,"UV_UNKNOWN_HANDLE == uv_guess_handle(-1)");
        abort();
      }
      iVar4 = uv_guess_handle(iVar2);
      if (iVar4 != 0xe) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
                ,0x5e,"UV_TTY == uv_guess_handle(ttyin_fd)");
        abort();
      }
      iVar4 = uv_guess_handle(iVar3);
      if (iVar4 != 0xe) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
                ,0x5f,"UV_TTY == uv_guess_handle(ttyout_fd)");
        abort();
      }
      uVar8 = uv_default_loop();
      height = uv_tty_init(uVar8,&tty_out.orig_termios.c_ospeed,iVar2,1);
      if (height != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
                ,0x62,"r == 0");
        abort();
      }
      iVar2 = uv_is_readable(&tty_out.orig_termios.c_ospeed);
      if (iVar2 == 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
                ,99,"uv_is_readable((uv_stream_t*) &tty_in)");
        abort();
      }
      iVar2 = uv_is_writable(&tty_out.orig_termios.c_ospeed);
      if (iVar2 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
                ,100,"!uv_is_writable((uv_stream_t*) &tty_in)");
        abort();
      }
      uVar8 = uv_default_loop();
      height = uv_tty_init(uVar8,&loop,iVar3,0);
      if (height != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
                ,0x67,"r == 0");
        abort();
      }
      iVar2 = uv_is_readable(&loop);
      if (iVar2 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
                ,0x68,"!uv_is_readable((uv_stream_t*) &tty_out)");
        abort();
      }
      iVar2 = uv_is_writable(&loop);
      if (iVar2 == 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
                ,0x69,"uv_is_writable((uv_stream_t*) &tty_out)");
        abort();
      }
      height = uv_tty_get_winsize(&loop,&ttyin_fd,&ttyout_fd);
      if (height != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
                ,0x6c,"r == 0");
        abort();
      }
      printf("width=%d height=%d\n",(ulong)(uint)ttyin_fd,(ulong)(uint)ttyout_fd);
      if ((ttyin_fd == 0) && (ttyout_fd == 0)) {
        puVar9 = (uv_loop_t *)uv_default_loop();
        close_loop(puVar9);
        uVar5 = uv_default_loop();
        iVar2 = uv_loop_close(uVar5);
        if (iVar2 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
                  ,0x73,"0 == uv_loop_close(uv_default_loop())");
          abort();
        }
        width = 1;
      }
      else {
        if (ttyin_fd < 0xb) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
                  ,0x7b,"width > 10");
          abort();
        }
        if (ttyout_fd < 0xb) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
                  ,0x7c,"height > 10");
          abort();
        }
        height = uv_tty_set_mode(&tty_out.orig_termios.c_ospeed,1);
        if (height != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
                  ,0x80,"r == 0");
          abort();
        }
        height = uv_tty_set_mode(&tty_out.orig_termios.c_ospeed,0);
        if (height != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
                  ,0x84,"r == 0");
          abort();
        }
        piVar6 = __errno_location();
        *piVar6 = 0;
        iVar2 = uv_tty_reset_mode();
        if (iVar2 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
                  ,0x88,"0 == uv_tty_reset_mode()");
          abort();
        }
        iVar2 = uv_tty_reset_mode();
        if (iVar2 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
                  ,0x89,"0 == uv_tty_reset_mode()");
          abort();
        }
        iVar2 = uv_tty_reset_mode();
        if (iVar2 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
                  ,0x8a,"0 == uv_tty_reset_mode()");
          abort();
        }
        piVar6 = __errno_location();
        if (*piVar6 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
                  ,0x8b,"0 == errno");
          abort();
        }
        uv_close(&tty_out.orig_termios.c_ospeed,0);
        uv_close(&loop,0);
        uv_run(uVar5,0);
        puVar9 = (uv_loop_t *)uv_default_loop();
        close_loop(puVar9);
        uVar5 = uv_default_loop();
        iVar2 = uv_loop_close(uVar5);
        if (iVar2 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
                  ,0x94,"0 == uv_loop_close(uv_default_loop())");
          abort();
        }
        width = 0;
      }
    }
  }
  return width;
}

Assistant:

TEST_IMPL(tty) {
  int r, width, height;
  int ttyin_fd, ttyout_fd;
  uv_tty_t tty_in, tty_out;
  uv_loop_t* loop = uv_default_loop();

  /* Make sure we have an FD that refers to a tty */
#ifdef _WIN32
  HANDLE handle;
  handle = CreateFileA("conin$",
                       GENERIC_READ | GENERIC_WRITE,
                       FILE_SHARE_READ | FILE_SHARE_WRITE,
                       NULL,
                       OPEN_EXISTING,
                       FILE_ATTRIBUTE_NORMAL,
                       NULL);
  ASSERT(handle != INVALID_HANDLE_VALUE);
  ttyin_fd = _open_osfhandle((intptr_t) handle, 0);

  handle = CreateFileA("conout$",
                       GENERIC_READ | GENERIC_WRITE,
                       FILE_SHARE_READ | FILE_SHARE_WRITE,
                       NULL,
                       OPEN_EXISTING,
                       FILE_ATTRIBUTE_NORMAL,
                       NULL);
  ASSERT(handle != INVALID_HANDLE_VALUE);
  ttyout_fd = _open_osfhandle((intptr_t) handle, 0);

#else /* unix */
  ttyin_fd = open("/dev/tty", O_RDONLY, 0);
  if (ttyin_fd < 0) {
    fprintf(stderr, "Cannot open /dev/tty as read-only: %s\n", strerror(errno));
    fflush(stderr);
    return TEST_SKIP;
  }

  ttyout_fd = open("/dev/tty", O_WRONLY, 0);
  if (ttyout_fd < 0) {
    fprintf(stderr, "Cannot open /dev/tty as write-only: %s\n", strerror(errno));
    fflush(stderr);
    return TEST_SKIP;
  }
#endif

  ASSERT(ttyin_fd >= 0);
  ASSERT(ttyout_fd >= 0);

  ASSERT(UV_UNKNOWN_HANDLE == uv_guess_handle(-1));

  ASSERT(UV_TTY == uv_guess_handle(ttyin_fd));
  ASSERT(UV_TTY == uv_guess_handle(ttyout_fd));

  r = uv_tty_init(uv_default_loop(), &tty_in, ttyin_fd, 1);  /* Readable. */
  ASSERT(r == 0);
  ASSERT(uv_is_readable((uv_stream_t*) &tty_in));
  ASSERT(!uv_is_writable((uv_stream_t*) &tty_in));

  r = uv_tty_init(uv_default_loop(), &tty_out, ttyout_fd, 0);  /* Writable. */
  ASSERT(r == 0);
  ASSERT(!uv_is_readable((uv_stream_t*) &tty_out));
  ASSERT(uv_is_writable((uv_stream_t*) &tty_out));

  r = uv_tty_get_winsize(&tty_out, &width, &height);
  ASSERT(r == 0);

  printf("width=%d height=%d\n", width, height);

  if (width == 0 && height == 0) {
   /* Some environments such as containers or Jenkins behave like this
    * sometimes */
    MAKE_VALGRIND_HAPPY();
    return TEST_SKIP;
  }

  /*
   * Is it a safe assumption that most people have terminals larger than
   * 10x10?
   */
  ASSERT(width > 10);
  ASSERT(height > 10);

  /* Turn on raw mode. */
  r = uv_tty_set_mode(&tty_in, UV_TTY_MODE_RAW);
  ASSERT(r == 0);

  /* Turn off raw mode. */
  r = uv_tty_set_mode(&tty_in, UV_TTY_MODE_NORMAL);
  ASSERT(r == 0);

  /* Calling uv_tty_reset_mode() repeatedly should not clobber errno. */
  errno = 0;
  ASSERT(0 == uv_tty_reset_mode());
  ASSERT(0 == uv_tty_reset_mode());
  ASSERT(0 == uv_tty_reset_mode());
  ASSERT(0 == errno);

  /* TODO check the actual mode! */

  uv_close((uv_handle_t*) &tty_in, NULL);
  uv_close((uv_handle_t*) &tty_out, NULL);

  uv_run(loop, UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}